

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Kernel::SerializeWithCachedSizes(Kernel *this,CodedOutputStream *output)

{
  if (this->_oneof_case_[0] == 1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->kernel_).linearkernel_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->kernel_).linearkernel_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 3) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->kernel_).linearkernel_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 4) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->kernel_).linearkernel_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void Kernel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Kernel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.LinearKernel linearKernel = 1;
  if (has_linearkernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *kernel_.linearkernel_, output);
  }

  // .CoreML.Specification.RBFKernel rbfKernel = 2;
  if (has_rbfkernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *kernel_.rbfkernel_, output);
  }

  // .CoreML.Specification.PolyKernel polyKernel = 3;
  if (has_polykernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *kernel_.polykernel_, output);
  }

  // .CoreML.Specification.SigmoidKernel sigmoidKernel = 4;
  if (has_sigmoidkernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *kernel_.sigmoidkernel_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Kernel)
}